

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quat.c
# Opt level: O0

void glmc_quat_mat3t(float *q,vec3 *dest)

{
  float fVar1;
  __m128 a;
  float *in_RSI;
  float *in_RDI;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float s;
  float norm;
  float wz;
  float wy;
  float wx;
  float xz;
  float yz;
  float xy;
  float zz;
  float yy;
  float xx;
  float z;
  float y;
  float x;
  float w;
  undefined8 in_stack_ffffffffffffff78;
  float local_7c;
  
  a._8_8_ = in_stack_ffffffffffffff78;
  a[0] = 1.64186e-39;
  a[1] = 0.0;
  local_7c = glmm_norm(a);
  if (local_7c <= 0.0) {
    local_7c = 0.0;
  }
  else {
    local_7c = 2.0 / local_7c;
  }
  fVar9 = *in_RDI;
  fVar7 = in_RDI[1];
  fVar10 = in_RDI[2];
  fVar1 = in_RDI[3];
  fVar2 = local_7c * fVar9 * fVar9;
  fVar3 = local_7c * fVar9 * fVar7;
  fVar4 = local_7c * fVar1 * fVar9;
  fVar5 = local_7c * fVar7 * fVar7;
  fVar6 = local_7c * fVar7 * fVar10;
  fVar7 = local_7c * fVar1 * fVar7;
  fVar8 = local_7c * fVar10 * fVar10;
  fVar9 = local_7c * fVar9 * fVar10;
  fVar10 = local_7c * fVar1 * fVar10;
  *in_RSI = (1.0 - fVar5) - fVar8;
  in_RSI[4] = (1.0 - fVar2) - fVar8;
  in_RSI[8] = (1.0 - fVar2) - fVar5;
  in_RSI[3] = fVar3 + fVar10;
  in_RSI[7] = fVar6 + fVar4;
  in_RSI[2] = fVar9 + fVar7;
  in_RSI[1] = fVar3 - fVar10;
  in_RSI[5] = fVar6 - fVar4;
  in_RSI[6] = fVar9 - fVar7;
  return;
}

Assistant:

CGLM_EXPORT
void
glmc_quat_mat3t(versor q, mat3 dest) {
  glm_quat_mat3t(q, dest);
}